

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_torn_write.cpp
# Opt level: O3

void TruncateWAL(FileSystem *fs,string *path,idx_t new_size)

{
  type pFVar1;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_20;
  
  (**(code **)(*(long *)fs + 0x10))(&local_20,fs,path,2,0x100,0);
  pFVar1 = duckdb::unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
           operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                      *)&local_20);
  (**(code **)(*(long *)fs + 0x60))(fs,pFVar1,new_size);
  if (local_20._M_head_impl != (FileHandle *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return;
}

Assistant:

static void TruncateWAL(FileSystem &fs, const string &path, idx_t new_size) {
	auto handle = fs.OpenFile(path, FileFlags::FILE_FLAGS_WRITE);
	fs.Truncate(*handle, new_size);
}